

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UBool __thiscall
icu_63::UCharCharacterIterator::operator==
          (UCharCharacterIterator *this,ForwardCharacterIterator *that)

{
  bool bVar1;
  bool local_31;
  UCharCharacterIterator *realThat;
  ForwardCharacterIterator *that_local;
  UCharCharacterIterator *this_local;
  
  if (this == (UCharCharacterIterator *)that) {
    this_local._7_1_ = true;
  }
  else {
    if (this == (UCharCharacterIterator *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)
                       (this->super_CharacterIterator).super_ForwardCharacterIterator.super_UObject.
                       _vptr_UObject[-1],(type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if (((((_func_int **)this->text == that[3].super_UObject._vptr_UObject) &&
           (local_31 = false,
           (this->super_CharacterIterator).textLength ==
           *(int *)&that[1].super_UObject._vptr_UObject)) &&
          (local_31 = false,
          (this->super_CharacterIterator).pos ==
          *(int *)((long)&that[1].super_UObject._vptr_UObject + 4))) &&
         (local_31 = false,
         (this->super_CharacterIterator).begin == *(int *)&that[2].super_UObject._vptr_UObject)) {
        local_31 = (this->super_CharacterIterator).end ==
                   *(int *)((long)&that[2].super_UObject._vptr_UObject + 4);
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
UCharCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    UCharCharacterIterator&    realThat = (UCharCharacterIterator&)that;

    return text == realThat.text
        && textLength == realThat.textLength
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}